

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIScrollBar::setMax(CGUIScrollBar *this,s32 max)

{
  int iVar1;
  ulong uVar2;
  
  this->Max = max;
  iVar1 = this->Min;
  if (max < this->Min) {
    this->Min = max;
    iVar1 = max;
  }
  uVar2 = (ulong)(1e-06 < ABS((float)(max - iVar1)));
  (*(this->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
            (this->UpButton,uVar2);
  (*(this->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
            (this->DownButton,uVar2);
  (**(code **)(*(long *)this + 0x168))(this,this->Pos);
  return;
}

Assistant:

void CGUIScrollBar::setMax(s32 max)
{
	Max = max;
	if (Min > Max)
		Min = Max;

	bool enable = core::isnotzero(range());
	UpButton->setEnabled(enable);
	DownButton->setEnabled(enable);
	setPos(Pos);
}